

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O2

intrusive_ptr<cppcms::impl::base_cache> __thiscall
cppcms::impl::process_cache_factory(impl *this,size_t memory,uint items)

{
  mem_cache<cppcms::impl::process_settings> *this_00;
  
  process_settings::init((EVP_PKEY_CTX *)memory);
  this_00 = (mem_cache<cppcms::impl::process_settings> *)
            mem_cache<cppcms::impl::process_settings>::operator_new
                      ((mem_cache<cppcms::impl::process_settings> *)0xe8,memory);
  mem_cache<cppcms::impl::process_settings>::mem_cache(this_00,items);
  *(mem_cache<cppcms::impl::process_settings> **)this = this_00;
  (*(this_00->super_base_cache)._vptr_base_cache[6])(this_00);
  return (intrusive_ptr<cppcms::impl::base_cache>)(base_cache *)this;
}

Assistant:

booster::intrusive_ptr<base_cache> process_cache_factory(size_t memory,unsigned items)
{
	process_settings::init(memory);
	return new mem_cache<process_settings>(items);
}